

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

uint * __thiscall cxxopts::OptionValue::as<unsigned_int>(OptionValue *this)

{
  long lVar1;
  uint *puVar2;
  string local_40;
  
  if ((this->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"No value","");
    throw_or_mimic<std::domain_error>(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  lVar1 = __dynamic_cast((this->m_value).
                         super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &Value::typeinfo,&values::standard_value<unsigned_int>::typeinfo,0);
  if (lVar1 != 0) {
    puVar2 = *(uint **)(lVar1 + 0x28);
    if (puVar2 == (uint *)0x0) {
      puVar2 = *(uint **)(lVar1 + 0x18);
    }
    return puVar2;
  }
  __cxa_bad_cast();
}

Assistant:

const T&
    as() const
    {
      if (m_value == nullptr) {
        throw_or_mimic<std::domain_error>("No value");
      }

#ifdef CXXOPTS_NO_RTTI
      return static_cast<const values::standard_value<T>&>(*m_value).get();
#else
      return dynamic_cast<const values::standard_value<T>&>(*m_value).get();
#endif
    }